

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O3

int __thiscall
OSSLRSA::sign(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  ByteString *pBVar4;
  size_t sVar5;
  size_t sVar6;
  RSA *pRVar7;
  uchar *puVar8;
  uchar *puVar9;
  EVP_MD *Hash;
  long lVar10;
  undefined8 uVar11;
  int iVar12;
  char *pcVar13;
  long in_stack_00000008;
  ByteString em;
  ByteString local_58;
  
  iVar3 = (int)tbs;
  if (iVar3 == 1) {
    cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
    if (cVar2 == '\0') {
      pcVar13 = "Invalid key type supplied";
      iVar3 = 0xed;
    }
    else {
      sVar5 = ByteString::size((ByteString *)sig);
      pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
      sVar6 = ByteString::size(pBVar4);
      if (sVar5 == sVar6) {
        pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
        sVar5 = ByteString::size(pBVar4);
        ByteString::resize((ByteString *)siglen,sVar5);
        pRVar7 = (RSA *)OSSLRSAPrivateKey::getOSSLKey((OSSLRSAPrivateKey *)ctx);
        iVar3 = RSA_blinding_on(pRVar7,(BN_CTX *)0x0);
        if (iVar3 == 0) {
          pcVar13 = "Failed to turn on blinding for OpenSSL RSA key";
          iVar3 = 0x103;
        }
        else {
          sVar5 = ByteString::size((ByteString *)sig);
          puVar8 = ByteString::const_byte_str((ByteString *)sig);
          puVar9 = ByteString::operator[]((ByteString *)siglen,0);
          iVar3 = RSA_private_encrypt((int)sVar5,puVar8,puVar9,pRVar7,3);
          RSA_blinding_off(pRVar7);
          if (iVar3 != -1) {
LAB_0015bd6d:
            ByteString::resize((ByteString *)siglen,(long)iVar3);
            return (int)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          }
          pcVar13 = "An error occurred while performing a raw RSA signature";
          iVar3 = 0x10e;
        }
      }
      else {
        pcVar13 = "Size of data to sign does not match the modulus size";
        iVar3 = 0xf7;
      }
    }
LAB_0015bde4:
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,iVar3,pcVar13);
    return 0;
  }
  if (iVar3 != 10) {
    if (iVar3 != 3) {
      iVar3 = AsymmetricAlgorithm::sign(&this->super_AsymmetricAlgorithm,ctx,sig,siglen,tbs,tbslen);
      return iVar3;
    }
    cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
    if (cVar2 == '\0') {
      pcVar13 = "Invalid key type supplied";
      iVar3 = 0x4f;
    }
    else {
      pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
      sVar5 = ByteString::size(pBVar4);
      sVar6 = ByteString::size((ByteString *)sig);
      if (sVar5 - 0xb < sVar6) {
        pcVar13 = "Data to sign exceeds maximum for PKCS #1 signature";
        iVar3 = 0x5c;
      }
      else {
        pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
        sVar5 = ByteString::size(pBVar4);
        ByteString::resize((ByteString *)siglen,sVar5);
        pRVar7 = (RSA *)OSSLRSAPrivateKey::getOSSLKey((OSSLRSAPrivateKey *)ctx);
        iVar3 = RSA_blinding_on(pRVar7,(BN_CTX *)0x0);
        if (iVar3 == 0) {
          pcVar13 = "Failed to turn on blinding for OpenSSL RSA key";
          iVar3 = 0x68;
        }
        else {
          sVar5 = ByteString::size((ByteString *)sig);
          puVar8 = ByteString::const_byte_str((ByteString *)sig);
          puVar9 = ByteString::operator[]((ByteString *)siglen,0);
          iVar3 = RSA_private_encrypt((int)sVar5,puVar8,puVar9,pRVar7,1);
          RSA_blinding_off(pRVar7);
          if (iVar3 != -1) goto LAB_0015bd6d;
          pcVar13 = "An error occurred while performing a PKCS #1 signature";
          iVar3 = 0x73;
        }
      }
    }
    goto LAB_0015bde4;
  }
  cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
  if (cVar2 == '\0') {
    pcVar13 = "Invalid key type supplied";
    iVar3 = 0x85;
    goto LAB_0015bde4;
  }
  if (tbslen == 0 || in_stack_00000008 != 0x10) {
    pcVar13 = "Invalid parameters supplied";
    iVar3 = 0x8c;
    goto LAB_0015bde4;
  }
  switch(*(undefined4 *)tbslen) {
  case 2:
    sVar5 = 0x14;
    Hash = EVP_sha1();
    break;
  case 3:
    sVar5 = 0x1c;
    Hash = EVP_sha224();
    break;
  case 4:
    sVar5 = 0x20;
    Hash = EVP_sha256();
    break;
  case 5:
    sVar5 = 0x30;
    Hash = EVP_sha384();
    break;
  case 6:
    sVar5 = 0x40;
    Hash = EVP_sha512();
    break;
  default:
    return 0;
  }
  pRVar7 = (RSA *)OSSLRSAPrivateKey::getOSSLKey((OSSLRSAPrivateKey *)ctx);
  sVar6 = ByteString::size((ByteString *)sig);
  if (sVar6 != sVar5) {
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0xb4,"Data to sign does not match expected (%d) for RSA PSS",sVar5);
    return 0;
  }
  uVar1 = *(ulong *)(tbslen + 8);
  lVar10 = (**(code **)(*(long *)ctx + 0x20))(ctx);
  if (((lVar10 + 6U >> 3) - sVar5) - 2 < uVar1) {
    uVar11 = (**(code **)(*(long *)ctx + 0x20))(ctx);
    softHSMLog(3,"sign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0xbd,"sLen (%lu) is too large for current key size (%lu)",uVar1,uVar11);
    return 0;
  }
  ByteString::ByteString(&local_58);
  pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
  sVar5 = ByteString::size(pBVar4);
  ByteString::resize(&local_58,sVar5);
  puVar8 = ByteString::operator[](&local_58,0);
  puVar9 = ByteString::const_byte_str((ByteString *)sig);
  iVar3 = RSA_padding_add_PKCS1_PSS_mgf1(pRVar7,puVar8,puVar9,Hash,Hash,*(int *)(tbslen + 8));
  if (iVar3 == 0) {
    pcVar13 = "Error in RSA PSS padding generation";
    iVar3 = 199;
  }
  else {
    iVar3 = RSA_blinding_on(pRVar7,(BN_CTX *)0x0);
    if (iVar3 != 0) {
      pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
      sVar5 = ByteString::size(pBVar4);
      ByteString::resize((ByteString *)siglen,sVar5);
      pBVar4 = (ByteString *)(**(code **)(*(long *)ctx + 0xb0))(ctx);
      sVar5 = ByteString::size(pBVar4);
      puVar8 = ByteString::operator[](&local_58,0);
      puVar9 = ByteString::operator[]((ByteString *)siglen,0);
      iVar3 = RSA_private_encrypt((int)sVar5,puVar8,puVar9,pRVar7,3);
      RSA_blinding_off(pRVar7);
      if (iVar3 == -1) {
        iVar12 = 0;
        softHSMLog(3,"sign",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0xdd,"An error occurred while performing the RSA-PSS signature");
      }
      else {
        iVar12 = (int)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        ByteString::resize((ByteString *)siglen,(long)iVar3);
      }
      goto LAB_0015c024;
    }
    pcVar13 = "Failed to turn on blinding for OpenSSL RSA key";
    iVar3 = 0xcf;
  }
  iVar12 = 0;
  softHSMLog(3,"sign",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
             ,iVar3,pcVar13);
LAB_0015c024:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return iVar12;
}

Assistant:

bool OSSLRSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		   ByteString& signature, const AsymMech::Type mechanism,
		   const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (mechanism == AsymMech::RSA_PKCS)
	{
		// Separate implementation for RSA PKCS #1 signing without hash computation

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// In case of PKCS #1 signing the length of the input data may not exceed 40% of the
		// modulus size
		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		size_t allowedLen = osslKey->getN().size() - 11;

		if (dataToSign.size() > allowedLen)
		{
			ERROR_MSG("Data to sign exceeds maximum for PKCS #1 signature");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		int sigLen = RSA_private_encrypt(dataToSign.size(), (unsigned char*) dataToSign.const_byte_str(), &signature[0], rsa, RSA_PKCS1_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing a PKCS #1 signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else if (mechanism == AsymMech::RSA_PKCS_PSS)
	{
		const RSA_PKCS_PSS_PARAMS *pssParam = (RSA_PKCS_PSS_PARAMS*)param;

		// Separate implementation for RSA PKCS #1 signing without hash computation

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		if (pssParam == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS))
		{
			ERROR_MSG("Invalid parameters supplied");

			return false;
		}

		size_t allowedLen;
		const EVP_MD* hash = NULL;

		switch (pssParam->hashAlg)
		{
		case HashAlgo::SHA1:
			hash = EVP_sha1();
			allowedLen = 20;
			break;
		case HashAlgo::SHA224:
			hash = EVP_sha224();
			allowedLen = 28;
			break;
		case HashAlgo::SHA256:
			hash = EVP_sha256();
			allowedLen = 32;
			break;
		case HashAlgo::SHA384:
			hash = EVP_sha384();
			allowedLen = 48;
			break;
		case HashAlgo::SHA512:
			hash = EVP_sha512();
			allowedLen = 64;
			break;
		default:
			return false;
		}

		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		RSA* rsa = osslKey->getOSSLKey();

		if (dataToSign.size() != allowedLen)
		{
			ERROR_MSG("Data to sign does not match expected (%d) for RSA PSS", (int)allowedLen);

			return false;
		}

		size_t sParamLen = pssParam->sLen;
		if (sParamLen > ((privateKey->getBitLength()+6)/8-2-allowedLen))
		{
			ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
				  (unsigned long)sParamLen, privateKey->getBitLength());
			return false;
		}

		ByteString em;
		em.resize(osslKey->getN().size());

		int status = RSA_padding_add_PKCS1_PSS_mgf1(rsa, &em[0], (unsigned char*) dataToSign.const_byte_str(), hash, hash, pssParam->sLen);
		if (!status)
		{
			ERROR_MSG("Error in RSA PSS padding generation");

			return false;
		}


		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		int sigLen = RSA_private_encrypt(osslKey->getN().size(), &em[0], &signature[0], rsa, RSA_NO_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing the RSA-PSS signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else if (mechanism == AsymMech::RSA)
	{
		// Separate implementation for raw RSA signing

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// In case of raw RSA, the length of the input data must match the length of the modulus
		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		if (dataToSign.size() != osslKey->getN().size())
		{
			ERROR_MSG("Size of data to sign does not match the modulus size");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		int sigLen = RSA_private_encrypt(dataToSign.size(), (unsigned char*) dataToSign.const_byte_str(), &signature[0], rsa, RSA_NO_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing a raw RSA signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else
	{
		// Call default implementation
		return AsymmetricAlgorithm::sign(privateKey, dataToSign, signature, mechanism, param, paramLen);
	}
}